

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

OPJ_UINT32 dwt_max_resolution_v2(opj_tcd_resolution_v2_t *r,OPJ_UINT32 i)

{
  opj_tcd_resolution_v2_t *poVar1;
  uint uVar2;
  OPJ_UINT32 w;
  OPJ_UINT32 mr;
  OPJ_UINT32 i_local;
  opj_tcd_resolution_v2_t *r_local;
  
  mr = 0;
  i_local = i;
  r_local = r;
  while (i_local = i_local - 1, i_local != 0) {
    poVar1 = r_local + 1;
    uVar2 = r_local[1].x1 - poVar1->x0;
    if (mr < uVar2) {
      mr = uVar2;
    }
    uVar2 = r_local[1].y1 - r_local[1].y0;
    r_local = poVar1;
    if (mr < uVar2) {
      mr = uVar2;
    }
  }
  return mr;
}

Assistant:

static OPJ_UINT32 dwt_max_resolution_v2(opj_tcd_resolution_v2_t* restrict r, OPJ_UINT32 i) {
	OPJ_UINT32 mr	= 0;
	OPJ_UINT32 w;
	while( --i ) {
		++r;
		if( mr < ( w = r->x1 - r->x0 ) )
			mr = w ;
		if( mr < ( w = r->y1 - r->y0 ) )
			mr = w ;
	}
	return mr ;
}